

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

string * __thiscall
spirv_cross::StringStream<4096ul,4096ul>::str_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  ulong *puVar1;
  long lVar2;
  Buffer *saved;
  ulong *puVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (*(long *)((long)this + 0x1020) != 0) {
    lVar2 = 0;
    do {
      lVar2 = lVar2 + 0x18;
    } while (*(long *)((long)this + 0x1020) * 0x18 != lVar2);
  }
  ::std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  if (*(long *)((long)this + 0x1020) != 0) {
    puVar3 = *(ulong **)((long)this + 0x1018);
    puVar1 = puVar3 + *(long *)((long)this + 0x1020) * 3;
    do {
      ::std::__cxx11::string::replace
                ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,(char *)0x0,
                 *puVar3);
      puVar3 = puVar3 + 3;
    } while (puVar3 != puVar1);
  }
  ::std::__cxx11::string::replace
            ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,(char *)0x0,
             *this);
  return __return_storage_ptr__;
}

Assistant:

std::string str() const
	{
		std::string ret;
		size_t target_size = 0;
		for (auto &saved : saved_buffers)
			target_size += saved.offset;
		target_size += current_buffer.offset;
		ret.reserve(target_size);

		for (auto &saved : saved_buffers)
			ret.insert(ret.end(), saved.buffer, saved.buffer + saved.offset);
		ret.insert(ret.end(), current_buffer.buffer, current_buffer.buffer + current_buffer.offset);
		return ret;
	}